

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O1

shared_ptr<Instance> get_shared_instance(string *type,string *value)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  _Alloc_hider _Var2;
  int iVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  shared_ptr<Instance> sVar5;
  undefined1 local_39;
  _Alloc_hider local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_30 [2];
  
  (type->_M_dataplus)._M_p = (pointer)0x0;
  type->_M_string_length = 0;
  iVar3 = std::__cxx11::string::compare((char *)value);
  if (iVar3 == 0) {
    local_38._M_p = (pointer)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<BooleanInstance,std::allocator<BooleanInstance>,std::__cxx11::string_const&>
              (a_Stack_30,(BooleanInstance **)&local_38,(allocator<BooleanInstance> *)&local_39,
               in_RDX);
    std::__shared_ptr<BooleanInstance,(__gnu_cxx::_Lock_policy)2>::
    _M_enable_shared_from_this_with<BooleanInstance,BooleanInstance>
              ((__shared_ptr<BooleanInstance,(__gnu_cxx::_Lock_policy)2> *)&local_38,
               (BooleanInstance *)local_38._M_p);
    _Var4._M_pi = a_Stack_30[0]._M_pi;
    _Var2._M_p = local_38._M_p;
    local_38._M_p = (pointer)0x0;
    a_Stack_30[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)type->_M_string_length;
    (type->_M_dataplus)._M_p = _Var2._M_p;
    type->_M_string_length = (size_type)_Var4._M_pi;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    }
    if (a_Stack_30[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_30[0]._M_pi);
    }
  }
  iVar3 = std::__cxx11::string::compare((char *)value);
  if (iVar3 == 0) {
    local_38._M_p = (pointer)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<CharacterInstance,std::allocator<CharacterInstance>,std::__cxx11::string_const&>
              (a_Stack_30,(CharacterInstance **)&local_38,(allocator<CharacterInstance> *)&local_39,
               in_RDX);
    std::__shared_ptr<CharacterInstance,(__gnu_cxx::_Lock_policy)2>::
    _M_enable_shared_from_this_with<CharacterInstance,CharacterInstance>
              ((__shared_ptr<CharacterInstance,(__gnu_cxx::_Lock_policy)2> *)&local_38,
               (CharacterInstance *)local_38._M_p);
    _Var4._M_pi = a_Stack_30[0]._M_pi;
    _Var2._M_p = local_38._M_p;
    local_38._M_p = (pointer)0x0;
    a_Stack_30[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)type->_M_string_length;
    (type->_M_dataplus)._M_p = _Var2._M_p;
    type->_M_string_length = (size_type)_Var4._M_pi;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    }
    if (a_Stack_30[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_30[0]._M_pi);
    }
  }
  iVar3 = std::__cxx11::string::compare((char *)value);
  if (iVar3 == 0) {
    local_38._M_p = (pointer)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<IntegerInstance,std::allocator<IntegerInstance>,std::__cxx11::string_const&>
              (a_Stack_30,(IntegerInstance **)&local_38,(allocator<IntegerInstance> *)&local_39,
               in_RDX);
    std::__shared_ptr<IntegerInstance,(__gnu_cxx::_Lock_policy)2>::
    _M_enable_shared_from_this_with<IntegerInstance,IntegerInstance>
              ((__shared_ptr<IntegerInstance,(__gnu_cxx::_Lock_policy)2> *)&local_38,
               (IntegerInstance *)local_38._M_p);
    _Var4._M_pi = a_Stack_30[0]._M_pi;
    _Var2._M_p = local_38._M_p;
    local_38._M_p = (pointer)0x0;
    a_Stack_30[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)type->_M_string_length;
    (type->_M_dataplus)._M_p = _Var2._M_p;
    type->_M_string_length = (size_type)_Var4._M_pi;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    }
    if (a_Stack_30[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_30[0]._M_pi);
    }
  }
  iVar3 = std::__cxx11::string::compare((char *)value);
  if (iVar3 == 0) {
    local_38._M_p = (pointer)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<FloatInstance,std::allocator<FloatInstance>,std::__cxx11::string_const&>
              (a_Stack_30,(FloatInstance **)&local_38,(allocator<FloatInstance> *)&local_39,in_RDX);
    std::__shared_ptr<FloatInstance,(__gnu_cxx::_Lock_policy)2>::
    _M_enable_shared_from_this_with<FloatInstance,FloatInstance>
              ((__shared_ptr<FloatInstance,(__gnu_cxx::_Lock_policy)2> *)&local_38,
               (FloatInstance *)local_38._M_p);
    _Var4._M_pi = a_Stack_30[0]._M_pi;
    _Var2._M_p = local_38._M_p;
    local_38._M_p = (pointer)0x0;
    a_Stack_30[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)type->_M_string_length;
    (type->_M_dataplus)._M_p = _Var2._M_p;
    type->_M_string_length = (size_type)_Var4._M_pi;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    }
    if (a_Stack_30[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_30[0]._M_pi);
    }
  }
  iVar3 = std::__cxx11::string::compare((char *)value);
  _Var4._M_pi = extraout_RDX;
  if (iVar3 == 0) {
    local_38._M_p = (pointer)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<StringInstance,std::allocator<StringInstance>,std::__cxx11::string_const&>
              (a_Stack_30,(StringInstance **)&local_38,(allocator<StringInstance> *)&local_39,in_RDX
              );
    std::__shared_ptr<StringInstance,(__gnu_cxx::_Lock_policy)2>::
    _M_enable_shared_from_this_with<StringInstance,StringInstance>
              ((__shared_ptr<StringInstance,(__gnu_cxx::_Lock_policy)2> *)&local_38,
               (StringInstance *)local_38._M_p);
    _Var4._M_pi = a_Stack_30[0]._M_pi;
    _Var2._M_p = local_38._M_p;
    local_38._M_p = (pointer)0x0;
    a_Stack_30[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)type->_M_string_length;
    (type->_M_dataplus)._M_p = _Var2._M_p;
    type->_M_string_length = (size_type)_Var4._M_pi;
    _Var4._M_pi = extraout_RDX_00;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
      _Var4._M_pi = extraout_RDX_01;
    }
    if (a_Stack_30[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_30[0]._M_pi);
      _Var4._M_pi = extraout_RDX_02;
    }
  }
  sVar5.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var4._M_pi;
  sVar5.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)type;
  return (shared_ptr<Instance>)sVar5.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Instance> get_shared_instance(const std::string& type, const std::string& value) {
    std::shared_ptr<Instance> instance;
    if (type == "Boolean")
        instance = std::make_shared<BooleanInstance>(value);
    if (type == "Character")
        instance = std::make_shared<CharacterInstance>(value);
    if (type == "Integer")
        instance = std::make_shared<IntegerInstance>(value);
    if (type == "Float")
        instance = std::make_shared<FloatInstance>(value);
    if (type == "String")
        instance = std::make_shared<StringInstance>(value);
    return instance;
}